

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_blitter.cpp
# Opt level: O3

void __thiscall
QBlitterPaintEngine::drawPixmap(QBlitterPaintEngine *this,QRectF *r,QPixmap *pm,QRectF *sr)

{
  undefined4 uVar1;
  undefined4 uVar2;
  QBlitterPaintEnginePrivate *this_00;
  QPaintEngineState *pQVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  QRasterBuffer *this_01;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  QBlittable *pQVar11;
  const_iterator pQVar12;
  const_iterator pQVar13;
  undefined4 extraout_var;
  QPaintDevice *pQVar14;
  QPaintEngineState *pQVar15;
  QRect *rect;
  QClipData *pQVar16;
  long in_FS_OFFSET;
  undefined1 local_78 [16];
  double local_68;
  double local_60;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QBlitterPaintEnginePrivate *)
            (this->super_QRasterPaintEngine).super_QPaintEngineEx.super_QPaintEngine.d_ptr.d;
  bVar6 = CapabilitiesToStateMask::canBlitterDrawPixmapOpacity(&this_00->caps,pm);
  if ((!bVar6) &&
     (bVar7 = CapabilitiesToStateMask::canBlitterDrawPixmap(&this_00->caps,r,pm,sr), !bVar7)) {
    pQVar11 = QBlittablePlatformPixmap::blittable(this_00->pmData);
    bVar6 = QBlittable::isLocked(pQVar11);
    if (!bVar6) {
      this_01 = (this_00->super_QRasterPaintEnginePrivate).rasterBuffer.d;
      iVar9 = (*(this_00->pmData->super_QPlatformPixmap)._vptr_QPlatformPixmap[0x16])();
      QRasterBuffer::prepare(this_01,(QImage *)CONCAT44(extraout_var,iVar9));
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QRasterPaintEngine::drawPixmap(&this->super_QRasterPaintEngine,r,pm,sr);
      return;
    }
    goto LAB_003b4fcb;
  }
  pQVar11 = QBlittablePlatformPixmap::blittable(this_00->pmData);
  QBlittable::unlock(pQVar11);
  local_58.xp = r->xp;
  local_58.yp = r->yp;
  local_58.w = r->w;
  local_58.h = r->h;
  if (this_00->hasXForm != 0) {
    pQVar3 = (this->super_QRasterPaintEngine).super_QPaintEngineEx.super_QPaintEngine.state;
    pQVar15 = pQVar3 + -2;
    if (pQVar3 == (QPaintEngineState *)0x0) {
      pQVar15 = (QPaintEngineState *)0x0;
    }
    QTransform::mapRect(&local_58,(QTransform *)(pQVar15 + 0x36),r);
  }
  pQVar15 = ((this_00->super_QRasterPaintEnginePrivate).super_QPaintEngineExPrivate.
             super_QPaintEnginePrivate.q_ptr)->state;
  if (((pQVar15 == (QPaintEngineState *)0x0) ||
      (pQVar16 = *(QClipData **)(pQVar15 + 0x100), pQVar16 == (QClipData *)0x0)) ||
     (bVar8 = pQVar16->field_0x48, (bVar8 & 1) == 0)) {
    pQVar16 = (this_00->super_QRasterPaintEnginePrivate).baseClip.d;
    if (pQVar16 != (QClipData *)0x0) {
      bVar8 = pQVar16->field_0x48;
      goto LAB_003b4db6;
    }
    pQVar14 = QPaintEngine::paintDevice((QPaintEngine *)this);
    iVar9 = (*pQVar14->_vptr_QPaintDevice[4])(pQVar14,1);
    pQVar14 = QPaintEngine::paintDevice((QPaintEngine *)this);
    iVar10 = (*pQVar14->_vptr_QPaintDevice[4])(pQVar14,2);
    local_60 = (double)iVar10;
    local_78 = ZEXT816(0);
    local_68 = (double)iVar9;
LAB_003b4f8f:
    QBlitterPaintEnginePrivate::clipAndDrawPixmap(this_00,(QRectF *)local_78,&local_58,pm,sr,bVar6);
  }
  else {
LAB_003b4db6:
    if ((bVar8 & 2) != 0) {
      uVar2 = (pQVar16->clipRect).x1;
      uVar5 = (pQVar16->clipRect).y1;
      local_78._8_4_ = SUB84((double)(int)uVar5,0);
      local_78._0_8_ = (double)(int)uVar2;
      local_78._12_4_ = (int)((ulong)(double)(int)uVar5 >> 0x20);
      local_60 = (double)(((long)(pQVar16->clipRect).y2.m_i - (long)(int)uVar5) + 1);
      local_68 = (double)(((long)(pQVar16->clipRect).x2.m_i - (long)(int)uVar2) + 1);
      goto LAB_003b4f8f;
    }
    if ((bVar8 & 4) != 0) {
      pQVar12 = QRegion::begin(&pQVar16->clipRegion);
      pQVar13 = QRegion::end(&pQVar16->clipRegion);
      for (; pQVar12 != pQVar13; pQVar12 = pQVar12 + 1) {
        uVar1 = pQVar12->x1;
        uVar4 = pQVar12->y1;
        local_78._8_4_ = SUB84((double)(int)uVar4,0);
        local_78._0_8_ = (double)(int)uVar1;
        local_78._12_4_ = (int)((ulong)(double)(int)uVar4 >> 0x20);
        local_68 = (double)(((long)(pQVar12->x2).m_i - (long)(int)uVar1) + 1);
        local_60 = (double)(((long)(pQVar12->y2).m_i - (long)(int)uVar4) + 1);
        QBlitterPaintEnginePrivate::clipAndDrawPixmap
                  (this_00,(QRectF *)local_78,&local_58,pm,sr,bVar6);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_003b4fcb:
  __stack_chk_fail();
}

Assistant:

void QBlitterPaintEngine::drawPixmap(const QRectF &r, const QPixmap &pm, const QRectF &sr)
{
    Q_D(QBlitterPaintEngine);
    bool canDrawOpacity;

    canDrawOpacity = d->caps.canBlitterDrawPixmapOpacity(pm);
    if (canDrawOpacity || (d->caps.canBlitterDrawPixmap(r, pm, sr))) {

        d->unlock();
        QRectF targetRect = r;
        if (d->hasXForm)
            targetRect = state()->matrix.mapRect(r);
        const QClipData *clipData = d->clip();
        if (clipData) {
            if (clipData->hasRectClip) {
                d->clipAndDrawPixmap(clipData->clipRect, targetRect, pm, sr, canDrawOpacity);
            } else if (clipData->hasRegionClip) {
                for (const QRect &rect : clipData->clipRegion)
                    d->clipAndDrawPixmap(rect, targetRect, pm, sr, canDrawOpacity);
            }
        } else {
            QRectF deviceRect(0, 0, paintDevice()->width(), paintDevice()->height());
            d->clipAndDrawPixmap(deviceRect, targetRect, pm, sr, canDrawOpacity);
        }
    }else {
        d->lock();
        d->pmData->markRasterOverlay(r);
        QRasterPaintEngine::drawPixmap(r, pm, sr);
    }
}